

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserAdams.cpp
# Opt level: O1

void chrono::utils::parseADMMarker
               (string *ID,
               vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *tokens,ChSystem *sys)

{
  size_t sVar1;
  long *plVar2;
  int iVar3;
  mapped_type *pmVar4;
  uint *puVar5;
  pointer ppVar6;
  undefined8 uVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  pointer ppVar11;
  bool bVar12;
  double dVar13;
  long *local_58;
  size_t local_50;
  long local_48 [2];
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_38;
  
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::adams_marker_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::adams_marker_struct>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::adams_marker_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::adams_marker_struct>_>_>
                         *)markers_map_abi_cxx11_,ID);
  ppVar6 = (tokens->
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_38 = tokens;
  if (ppVar6 != (tokens->
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (ppVar6->first == 1) {
        local_58 = local_48;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"PART","");
        sVar1 = (ppVar6->second)._M_string_length;
        if (sVar1 == local_50) {
          if (sVar1 == 0) {
            bVar12 = true;
          }
          else {
            iVar3 = bcmp((ppVar6->second)._M_dataplus._M_p,local_58,sVar1);
            bVar12 = iVar3 == 0;
          }
        }
        else {
          bVar12 = false;
        }
        if (local_58 != local_48) {
          operator_delete(local_58,local_48[0] + 1);
        }
        if (bVar12) {
          ppVar6 = ppVar6 + 1;
          std::__cxx11::string::_M_assign((string *)pmVar4);
        }
        local_58 = local_48;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"QP","");
        sVar1 = (ppVar6->second)._M_string_length;
        if (sVar1 == local_50) {
          if (sVar1 == 0) {
            bVar12 = true;
          }
          else {
            iVar3 = bcmp((ppVar6->second)._M_dataplus._M_p,local_58,sVar1);
            bVar12 = iVar3 == 0;
          }
        }
        else {
          bVar12 = false;
        }
        if (local_58 != local_48) {
          operator_delete(local_58,local_48[0] + 1);
        }
        if (bVar12) {
          puVar5 = (uint *)__errno_location();
          uVar10 = 0;
          do {
            plVar2 = (long *)ppVar6[1].second._M_dataplus._M_p;
            uVar9 = *puVar5;
            *puVar5 = 0;
            dVar13 = strtod((char *)plVar2,(char **)&local_58);
            if (local_58 == plVar2) {
              std::__throw_invalid_argument("stod");
              goto LAB_0096711b;
            }
            if (*puVar5 == 0) {
              *puVar5 = uVar9;
            }
            else if (*puVar5 == 0x22) goto LAB_00967127;
            ppVar6 = ppVar6 + 1;
            pmVar4->loc[uVar10] = dVar13;
            uVar10 = uVar10 + 1;
          } while (uVar10 != 3);
        }
        local_58 = local_48;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"REULER","");
        sVar1 = (ppVar6->second)._M_string_length;
        if (sVar1 == local_50) {
          if (sVar1 == 0) {
            bVar12 = true;
          }
          else {
            iVar3 = bcmp((ppVar6->second)._M_dataplus._M_p,local_58,sVar1);
            bVar12 = iVar3 == 0;
          }
        }
        else {
          bVar12 = false;
        }
        if (local_58 != local_48) {
          operator_delete(local_58,local_48[0] + 1);
        }
        if (bVar12) {
          puVar5 = (uint *)__errno_location();
          lVar8 = 0;
          ppVar11 = ppVar6;
          do {
            plVar2 = (long *)ppVar11[1].second._M_dataplus._M_p;
            uVar9 = *puVar5;
            uVar10 = (ulong)uVar9;
            *puVar5 = 0;
            dVar13 = strtod((char *)plVar2,(char **)&local_58);
            if (local_58 == plVar2) {
LAB_0096711b:
              std::__throw_invalid_argument("stod");
LAB_00967127:
              uVar9 = (uint)uVar10;
              std::__throw_out_of_range("stod");
LAB_00967133:
              uVar7 = std::__throw_out_of_range("stod");
              if (*puVar5 != 0) {
                _Unwind_Resume(uVar7);
              }
              *puVar5 = uVar9;
              _Unwind_Resume(uVar7);
            }
            if (*puVar5 == 0) {
              *puVar5 = uVar9;
            }
            else if (*puVar5 == 0x22) goto LAB_00967133;
            ppVar6 = ppVar11 + 1;
            bVar12 = ppVar11[1].second._M_dataplus._M_p[ppVar11[1].second._M_string_length - 1] ==
                     'D';
            pmVar4->rot[lVar8] =
                 (double)((ulong)bVar12 * (long)(dVar13 * 0.017453292519943295) +
                         (ulong)!bVar12 * (long)dVar13);
            lVar8 = lVar8 + 1;
            ppVar11 = ppVar6;
          } while (lVar8 != 3);
        }
      }
      ppVar6 = ppVar6 + 1;
    } while (ppVar6 != (local_38->
                       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void parseADMMarker(std::string ID, std::vector<std::pair<int, std::string>>& tokens, ChSystem& sys) {
    adams_marker_struct& marker = markers_map[ID];  // uses default contructor
    auto iter = tokens.begin();
    while (iter != tokens.end()) {
        // std::cout << "token is " << iter->first << ", " << iter->second <<std::endl;
        if (iter->first == LABEL) {
            if (iter->second == std::string("PART")) {
                iter++;
                marker.part_id = iter->second;
            }
            if (iter->second == std::string("QP")) {
                // std::cout << "reading loc " <<std::endl;

                for (int i = 0; i < 3; i++) {
                    iter++;
                    // std::cout << "token is " << iter->first << ", " << iter->second <<std::endl;

                    marker.loc[i] = std::stod(iter->second);
                }
            }
            if (iter->second == std::string("REULER")) {
                // std::cout << "reading rot " <<std::endl;
                for (int i = 0; i < 3; i++) {
                    iter++;
                    // std::cout << "token is " << iter->first << ", " << iter->second <<std::endl;
                    double val = std::stod(iter->second);

                    if (iter->second.back() == 'D') {
                        // This is a decimal and we need to convert to radians
                        val *= CH_C_DEG_TO_RAD;
                    }
                    // std::cout << "val is " << val <<std::endl;
                    marker.rot[i] = val;
                }
            }
        }

        iter++;
    }
}